

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

void google::Append(State *state,char *str,int length)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      if ((state->overflowed & 1U) == 0) {
        *state->out_cur = '\0';
      }
      return;
    }
    if (state->out_end <= state->out_cur + 1) break;
    *state->out_cur = str[uVar1];
    state->out_cur = state->out_cur + 1;
    uVar1 = uVar1 + 1;
  }
  state->overflowed = true;
  return;
}

Assistant:

static void Append(State *state, const char * const str, const int length) {
  int i;
  for (i = 0; i < length; ++i) {
    if (state->out_cur + 1 < state->out_end) {  // +1 for '\0'
      *state->out_cur = str[i];
      ++state->out_cur;
    } else {
      state->overflowed = true;
      break;
    }
  }
  if (!state->overflowed) {
    *state->out_cur = '\0';  // Terminate it with '\0'
  }
}